

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_game.cxx
# Opt level: O1

void __thiscall xray_re::xr_level_game::save(xr_level_game *this,xr_writer *w)

{
  pointer ppwVar1;
  pointer ppmVar2;
  uint32_t uVar3;
  pointer ppwVar4;
  pointer ppmVar5;
  way_path_io local_32;
  mp_rpoint_io local_31;
  
  xr_writer::open_chunk(w,0x1000);
  ppwVar4 = (this->m_paths).
            super__Vector_base<xray_re::way_path_*,_std::allocator<xray_re::way_path_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppwVar1 = (this->m_paths).
            super__Vector_base<xray_re::way_path_*,_std::allocator<xray_re::way_path_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppwVar4 != ppwVar1) {
    uVar3 = 0;
    do {
      xr_writer::open_chunk(w,uVar3);
      way_path_io::operator()(&local_32,*ppwVar4,w);
      xr_writer::close_chunk(w);
      ppwVar4 = ppwVar4 + 1;
      uVar3 = uVar3 + 1;
    } while (ppwVar4 != ppwVar1);
  }
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0x2000);
  ppmVar5 = (this->m_rpoints).
            super__Vector_base<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppmVar2 = (this->m_rpoints).
            super__Vector_base<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppmVar5 != ppmVar2) {
    uVar3 = 0;
    do {
      xr_writer::open_chunk(w,uVar3);
      mp_rpoint_io::operator()(&local_31,*ppmVar5,w);
      xr_writer::close_chunk(w);
      ppmVar5 = ppmVar5 + 1;
      uVar3 = uVar3 + 1;
    } while (ppmVar5 != ppmVar2);
  }
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_level_game::save(xr_writer& w) const
{
	w.open_chunk(GAME_CHUNK_WAYS);
	w.w_chunks(m_paths, way_path_io());
	w.close_chunk();

	w.open_chunk(GAME_CHUNK_RPOINTS);
	w.w_chunks(m_rpoints, mp_rpoint_io());
	w.close_chunk();
}